

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void loadVData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
              QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
              QMultiHash<char,_QLatin1String> *other)

{
  if (vDataInitialized == '\0') {
    initVData();
    vDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&v_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&v_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&v_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&v_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&v_other);
  return;
}

Assistant:

void loadVData(QMultiHash<char, QLatin1String> &types,
               QMultiHash<char, QLatin1String> &keywords,
               QMultiHash<char, QLatin1String> &builtin,
               QMultiHash<char, QLatin1String> &literals,
               QMultiHash<char, QLatin1String> &other) {
    if (!vDataInitialized) {
        initVData();
        vDataInitialized = true;
    }
    types = v_types;
    keywords = v_keywords;
    builtin = v_builtin;
    literals = v_literals;
    other = v_other;
}